

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall wallet::LegacyDataSPKM::GetKey(LegacyDataSPKM *this,CKeyID *address,CKey *keyOut)

{
  long lVar1;
  WalletStorage *pWVar2;
  undefined1 uVar3;
  int iVar4;
  const_iterator cVar5;
  long in_FS_OFFSET;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock33,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x3f7,false);
  iVar4 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
  if ((char)iVar4 == '\0') {
    uVar3 = FillableSigningProvider::GetKey(&this->super_FillableSigningProvider,address,keyOut);
  }
  else {
    cVar5 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->mapCryptedKeys)._M_t,address);
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header) {
      uVar3 = 0;
    }
    else {
      pWVar2 = (this->super_ScriptPubKeyMan).m_storage;
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = operator_new(0x18);
      *(_Base_ptr *)local_58._M_unused._0_8_ = cVar5._M_node + 4;
      *(_Base_ptr **)((long)local_58._M_unused._0_8_ + 8) = &cVar5._M_node[1]._M_right;
      *(CKey **)((long)local_58._M_unused._0_8_ + 0x10) = keyOut;
      pcStack_40 = std::
                   _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:1025:44)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp:1025:44)>
                 ::_M_manager;
      iVar4 = (*pWVar2->_vptr_WalletStorage[8])(pWVar2);
      uVar3 = (undefined1)iVar4;
      std::_Function_base::~_Function_base((_Function_base *)&local_58);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetKey(const CKeyID &address, CKey& keyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::GetKey(address, keyOut);
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        const CPubKey &vchPubKey = (*mi).second.first;
        const std::vector<unsigned char> &vchCryptedSecret = (*mi).second.second;
        return m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
            return DecryptKey(encryption_key, vchCryptedSecret, vchPubKey, keyOut);
        });
    }
    return false;
}